

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

char * duckdb_snappy::EmitLiteral<true>(char *op,char *literal,int len)

{
  undefined8 uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  
  uVar3 = len - 1;
  if (len < 0x11) {
    *op = (char)uVar3 << 2;
    uVar1 = *(undefined8 *)(literal + 8);
    *(undefined8 *)(op + 1) = *(undefined8 *)literal;
    *(undefined8 *)(op + 9) = uVar1;
    return op + (long)len + 1;
  }
  if ((uint)len < 0x3d) {
    bVar2 = (char)uVar3 << 2;
    pcVar5 = op;
  }
  else {
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0x18) >> 3 ^ 3;
    *(uint *)(op + 1) = uVar3;
    bVar2 = (char)uVar4 * '\x04' | 0xf0;
    pcVar5 = op + (ulong)uVar4 + 1;
  }
  *op = bVar2;
  pcVar6 = pcVar5 + 1;
  do {
    uVar1 = *(undefined8 *)(literal + 8);
    *(undefined8 *)pcVar6 = *(undefined8 *)literal;
    *(undefined8 *)(pcVar6 + 8) = uVar1;
    pcVar6 = pcVar6 + 0x10;
    literal = literal + 0x10;
  } while (pcVar6 < pcVar5 + (ulong)(uint)len + 1);
  return pcVar5 + (ulong)(uint)len + 1;
}

Assistant:

static inline char* EmitLiteral(char* op, const char* literal, int len) {
  // The vast majority of copies are below 16 bytes, for which a
  // call to std::memcpy() is overkill. This fast path can sometimes
  // copy up to 15 bytes too much, but that is okay in the
  // main loop, since we have a bit to go on for both sides:
  //
  //   - The input will always have kInputMarginBytes = 15 extra
  //     available bytes, as long as we're in the main loop, and
  //     if not, allow_fast_path = false.
  //   - The output will always have 32 spare bytes (see
  //     MaxCompressedLength).
  assert(len > 0);  // Zero-length literals are disallowed
  int n = len - 1;
  if (allow_fast_path && len <= 16) {
    // Fits in tag byte
    *op++ = LITERAL | (n << 2);

    UnalignedCopy128(literal, op);
    return op + len;
  }

  if (n < 60) {
    // Fits in tag byte
    *op++ = LITERAL | (n << 2);
  } else {
    int count = (Bits::Log2Floor(n) >> 3) + 1;
    assert(count >= 1);
    assert(count <= 4);
    *op++ = LITERAL | ((59 + count) << 2);
    // Encode in upcoming bytes.
    // Write 4 bytes, though we may care about only 1 of them. The output buffer
    // is guaranteed to have at least 3 more spaces left as 'len >= 61' holds
    // here and there is a std::memcpy() of size 'len' below.
    LittleEndian::Store32(op, n);
    op += count;
  }
  // When allow_fast_path is true, we can overwrite up to 16 bytes.
  if (allow_fast_path) {
    char* destination = op;
    const char* source = literal;
    const char* end = destination + len;
    do {
      std::memcpy(destination, source, 16);
      destination += 16;
      source += 16;
    } while (destination < end);
  } else {
    std::memcpy(op, literal, len);
  }
  return op + len;
}